

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O0

void __thiscall
string_view_cbegin_cend_Test::~string_view_cbegin_cend_Test(string_view_cbegin_cend_Test *this)

{
  string_view_cbegin_cend_Test *this_local;
  
  ~string_view_cbegin_cend_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(string_view, cbegin_cend) {
  const string_view sv("012345");

  char count = 0;
  for (auto iter = sv.cbegin(), end = sv.cend(); iter != end; ++iter) {
    ASSERT_EQ('0' + count, *iter);
    ++count;
  }
  ASSERT_EQ(6, count);
}